

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool duckdb::DictionaryCompression::HasEnoughSpace
               (idx_t current_count,idx_t index_count,idx_t dict_size,
               bitpacking_width_t packing_width,idx_t block_size)

{
  idx_t iVar1;
  undefined8 in_RDI;
  ulong in_R8;
  undefined7 in_stack_00000008;
  
  iVar1 = RequiredSpace(dict_size,CONCAT17(packing_width,in_stack_00000008),block_size,
                        (bitpacking_width_t)((ulong)in_RDI >> 0x38));
  return iVar1 <= in_R8;
}

Assistant:

bool DictionaryCompression::HasEnoughSpace(idx_t current_count, idx_t index_count, idx_t dict_size,
                                           bitpacking_width_t packing_width, const idx_t block_size) {
	return RequiredSpace(current_count, index_count, dict_size, packing_width) <= block_size;
}